

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalCreate::Deserialize(LogicalCreate *this,Deserializer *deserializer)

{
  LogicalOperatorType type;
  LogicalCreate *this_00;
  ClientContext *context;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_30;
  CreateInfo *local_28;
  
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>>
            ((Deserializer *)&stack0xffffffffffffffd8,(field_id_t)deserializer,(char *)0xc8);
  this_00 = (LogicalCreate *)operator_new(0x78);
  type = SerializationData::Get<duckdb::LogicalOperatorType>(&deserializer->data);
  context = SerializationData::Get<duckdb::ClientContext&>(&deserializer->data);
  local_30._M_head_impl = local_28;
  local_28 = (CreateInfo *)0x0;
  LogicalCreate(this_00,type,context,
                (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
                &local_30);
  if (local_30._M_head_impl != (CreateInfo *)0x0) {
    (*((local_30._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  local_30._M_head_impl = (CreateInfo *)0x0;
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)this_00;
  if (local_28 != (CreateInfo *)0x0) {
    (**(code **)(*(_func_int **)local_28 + 8))();
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalCreate::Deserialize(Deserializer &deserializer) {
	auto info = deserializer.ReadPropertyWithDefault<unique_ptr<CreateInfo>>(200, "info");
	auto result = duckdb::unique_ptr<LogicalCreate>(new LogicalCreate(deserializer.Get<LogicalOperatorType>(), deserializer.Get<ClientContext &>(), std::move(info)));
	return std::move(result);
}